

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<int>::InternalDeallocate<false>(RepeatedField<int> *this)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint index;
  uint extraout_EAX_01;
  ulong *puVar4;
  ulong *extraout_RAX;
  ulong in_RCX;
  int extraout_EDX;
  uint size;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  char in_SIL;
  char cVar5;
  int iVar6;
  undefined1 *puVar7;
  RepeatedField<int> *this_00;
  LongSooRep *this_01;
  SooRep *pSVar8;
  RepeatedPtrFieldBase *pRVar9;
  long *plVar10;
  undefined1 auStack_f8 [8];
  undefined8 uStack_f0;
  undefined1 auStack_e0 [8];
  undefined8 uStack_d8;
  undefined1 auStack_c8 [8];
  code *pcStack_c0;
  undefined1 auStack_88 [8];
  code *pcStack_80;
  undefined8 uStack_68;
  undefined1 auStack_58 [24];
  LongSooRep LStack_40;
  SooRep SStack_28;
  RepeatedField<int> local_10;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    SStack_28.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x1d67a8;
    InternalDeallocate<false>(this);
    return;
  }
  this_00 = &local_10;
  SStack_28.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x1d67b7;
  InternalDeallocate<false>(this_00);
  uVar1 = (this_00->soo_rep_).field_0.long_rep.elements_int;
  if (((uVar1 & 4) == 0) == (bool)in_SIL) {
    if (in_RCX == 0) goto LAB_001d680e;
    puVar4 = (ulong *)(in_RCX & 7);
    if (puVar4 == (ulong *)0x0) {
      if (in_SIL != '\0') {
        (this_00->soo_rep_).field_0.long_rep.size = (uint)uVar1 & 3;
      }
      (this_00->soo_rep_).field_0.long_rep.capacity = extraout_EDX;
      (this_00->soo_rep_).field_0.long_rep.elements_int = in_RCX | 4;
      return;
    }
  }
  else {
    LStack_40.size = 0x1d680e;
    LStack_40.capacity = 0;
    internal::SooRep::set_non_soo();
LAB_001d680e:
    LStack_40.size = 0x1d6818;
    LStack_40.capacity = 0;
    internal::SooRep::set_non_soo(&SStack_28);
    puVar4 = extraout_RAX;
  }
  iVar6 = (int)&SStack_28;
  LStack_40.size = 0x1d6825;
  LStack_40.capacity = 0;
  internal::SooRep::set_non_soo();
  if ((*puVar4 & 4) == 0) {
    return;
  }
  this_01 = &LStack_40;
  auStack_58._8_8_ = heap_rep;
  internal::SooRep::soo_arena();
  if ((this_01->elements_int & 4) != 0) {
    uStack_68 = 0x1d684e;
    internal::LongSooRep::elements(this_01);
    return;
  }
  pSVar8 = (SooRep *)auStack_58;
  uStack_68 = 0x1d6861;
  heap_rep();
  iVar2 = 2;
  if (iVar6 == 0) {
    iVar2 = (pSVar8->field_0).long_rep.capacity;
  }
  if ((int)size <= iVar2) {
    internal::SooRep::set_size(pSVar8,SUB41(iVar6,0),size);
    return;
  }
  puVar4 = (ulong *)(ulong)size;
  cVar5 = (char)iVar2;
  pcStack_80 = internal::SooRep::set_size;
  set_size();
  if (((*puVar4 & 4) == 0) == (bool)cVar5) {
    if (cVar5 == '\0') {
      *(uint *)(puVar4 + 1) = extraout_EDX_00;
    }
    else {
      uVar3 = extraout_EDX_00;
      if (3 < (int)extraout_EDX_00) goto LAB_001d68db;
      *puVar4 = (long)(int)extraout_EDX_00 | *puVar4 & 0xfffffffffffffff8;
    }
    return;
  }
  internal::SooRep::set_size();
  uVar3 = extraout_EDX_01;
LAB_001d68db:
  puVar7 = auStack_88;
  pSVar8 = (SooRep *)(ulong)uVar3;
  internal::SooRep::set_size();
  if ((int)puVar7 < 0) {
    pcStack_c0 = (code *)0x1d6936;
    Mutable();
    uVar3 = extraout_EAX;
  }
  else {
    pcStack_c0 = (code *)0x1d6906;
    uVar3 = internal::SooRep::size
                      (pSVar8,(undefined1  [16])
                              ((undefined1  [16])pSVar8->field_0 & (undefined1  [16])0x4) ==
                              (undefined1  [16])0x0);
    if ((int)puVar7 < (int)uVar3) {
      pcStack_c0 = (code *)0x1d691c;
      elements((RepeatedField<int> *)pSVar8,
               (undefined1  [16])((undefined1  [16])pSVar8->field_0 & (undefined1  [16])0x4) ==
               (undefined1  [16])0x0);
      return;
    }
  }
  pRVar9 = (RepeatedPtrFieldBase *)((ulong)puVar7 & 0xffffffff);
  pcStack_c0 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
  ;
  Mutable();
  if ((int)uVar3 < 0) {
    uVar3 = (uint)auStack_c8;
    uStack_d8 = 0x1d696f;
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>();
    index = extraout_EAX_00;
  }
  else {
    index = pRVar9->current_size_;
    if ((int)uVar3 < (int)index) {
      uStack_d8 = 0x1d6958;
      internal::RepeatedPtrFieldBase::element_at(pRVar9,uVar3);
      return;
    }
  }
  pRVar9 = (RepeatedPtrFieldBase *)(ulong)uVar3;
  uStack_d8 = 0x1d697d;
  internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>();
  if ((int)index < 0) {
    index = (uint)auStack_e0;
    uStack_f0 = 0x1d69a9;
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
              ();
    uVar3 = extraout_EAX_01;
  }
  else {
    uVar3 = pRVar9->current_size_;
    if ((int)index < (int)uVar3) {
      uStack_f0 = 0x1d6992;
      internal::RepeatedPtrFieldBase::element_at(pRVar9,index);
      return;
    }
  }
  pRVar9 = (RepeatedPtrFieldBase *)(ulong)index;
  uStack_f0 = 0x1d69b7;
  internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
            ();
  if ((int)uVar3 < 0) {
    uVar3 = (uint)auStack_f8;
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
              ();
  }
  else if ((int)uVar3 < pRVar9->current_size_) {
    internal::RepeatedPtrFieldBase::element_at(pRVar9,uVar3);
    return;
  }
  plVar10 = (long *)(ulong)uVar3;
  internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>();
  if (*plVar10 == 1) {
    return;
  }
  if (*plVar10 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  __assert_fail("is_soo()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf7c,
                "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::soo_slot() [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
               );
}

Assistant:

void InternalDeallocate() {
    ABSL_DCHECK(!is_soo());
    const size_t bytes = Capacity(false) * sizeof(Element) + kHeapRepHeaderSize;
    if (heap_rep()->arena == nullptr) {
      internal::SizedDelete(heap_rep(), bytes);
    } else if (!in_destructor) {
      // If we are in the destructor, we might be being destroyed as part of
      // the arena teardown. We can't try and return blocks to the arena then.
      heap_rep()->arena->ReturnArrayMemory(heap_rep(), bytes);
    }
  }